

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O0

bool vkb::detail::check_layer_supported
               (vector<VkLayerProperties,_std::allocator<VkLayerProperties>_> *available_layers,
               char *layer_name)

{
  bool bVar1;
  int iVar2;
  reference __s2;
  VkLayerProperties *layer_properties;
  const_iterator __end2;
  const_iterator __begin2;
  vector<VkLayerProperties,_std::allocator<VkLayerProperties>_> *__range2;
  char *layer_name_local;
  vector<VkLayerProperties,_std::allocator<VkLayerProperties>_> *available_layers_local;
  
  if (layer_name != (char *)0x0) {
    __end2 = std::vector<VkLayerProperties,_std::allocator<VkLayerProperties>_>::begin
                       (available_layers);
    layer_properties =
         (VkLayerProperties *)
         std::vector<VkLayerProperties,_std::allocator<VkLayerProperties>_>::end(available_layers);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_VkLayerProperties_*,_std::vector<VkLayerProperties,_std::allocator<VkLayerProperties>_>_>
                                       *)&layer_properties), bVar1) {
      __s2 = __gnu_cxx::
             __normal_iterator<const_VkLayerProperties_*,_std::vector<VkLayerProperties,_std::allocator<VkLayerProperties>_>_>
             ::operator*(&__end2);
      iVar2 = strcmp(layer_name,__s2->layerName);
      if (iVar2 == 0) {
        return true;
      }
      __gnu_cxx::
      __normal_iterator<const_VkLayerProperties_*,_std::vector<VkLayerProperties,_std::allocator<VkLayerProperties>_>_>
      ::operator++(&__end2);
    }
  }
  return false;
}

Assistant:

bool check_layer_supported(std::vector<VkLayerProperties> const& available_layers, const char* layer_name) {
    if (!layer_name) return false;
    for (const auto& layer_properties : available_layers) {
        if (strcmp(layer_name, layer_properties.layerName) == 0) {
            return true;
        }
    }
    return false;
}